

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.c
# Opt level: O0

int main(void)

{
  undefined1 local_28 [8];
  nn_thread thread;
  
  thread.handle._4_4_ = 0;
  sb = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/block.c"
                        ,0x37,1,0x10);
  test_bind_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/block.c"
                 ,0x38,sb,"inproc://a");
  sc = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/block.c"
                        ,0x39,1,0x10);
  test_connect_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/block.c"
                    ,0x3a,sc,"inproc://a");
  nn_thread_init((nn_thread *)local_28,worker,(void *)0x0);
  test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/block.c"
                 ,0x3e,sb,"ABC");
  test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/block.c"
                 ,0x3f,sb,"ABC");
  nn_thread_term((nn_thread *)local_28);
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/block.c"
                  ,0x43,sc);
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/block.c"
                  ,0x44,sb);
  return 0;
}

Assistant:

int main ()
{
    struct nn_thread thread;

    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, SOCKET_ADDRESS);
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, SOCKET_ADDRESS);

    nn_thread_init (&thread, worker, NULL);

    test_recv (sb, "ABC");
    test_recv (sb, "ABC");

    nn_thread_term (&thread);

    test_close (sc);
    test_close (sb);

    return 0;
}